

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-01.cpp
# Opt level: O3

bool __thiscall
baryonyx::itm::
solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>
::
push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>
           *this,bit_array *x,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last,float kappa,
          float delta,float theta,float objective_amplifier)

{
  uint *args_1;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  undefined1 auVar1 [16];
  int *piVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  row_iterator prVar7;
  ulong uVar8;
  rc_data *__first;
  uint r_size;
  rc_data *prVar9;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  int k;
  int selected;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  int local_8c;
  int local_88;
  uint local_84;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  rc_data *local_70;
  int *local_68;
  bit_array *local_60;
  solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>
  *local_58;
  int *local_50;
  undefined8 local_48;
  _Head_base<0UL,_int_*,_false> local_40;
  row_iterator local_38;
  
  fmt._M_str = "push-update-row {} {} {}\n";
  fmt._M_len = 0x19;
  local_80 = objective_amplifier;
  local_7c = theta;
  local_78 = delta;
  local_74 = kappa;
  debug_logger<true>::log<float,float,float>
            ((debug_logger<true> *)this,fmt,&local_74,&local_78,&local_7c);
  if (first._M_current == last._M_current) {
    local_48 = 0;
  }
  else {
    local_58 = this + 0x10;
    local_48 = 0;
    local_60 = x;
    local_50 = last._M_current;
    do {
      local_8c = *first._M_current;
      sparse_matrix<int>::row((sparse_matrix<int> *)&local_40,(int)local_58);
      if (local_38 != (row_iterator)local_40._M_head_impl) {
        lVar6 = *(long *)(this + 0x50);
        prVar7 = local_38;
        do {
          piVar2 = &prVar7->value;
          prVar7 = prVar7 + 1;
          *(float *)(lVar6 + (long)*piVar2 * 4) = local_7c * *(float *)(lVar6 + (long)*piVar2 * 4);
        } while (prVar7 != (row_iterator)local_40._M_head_impl);
      }
      uVar4 = solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>
              ::compute_reduced_costs<baryonyx::bit_array>
                        ((solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                          *)this,local_38,(row_iterator)local_40._M_head_impl,x);
      r_size = uVar4;
      if (uVar4 != 0) {
        __first = *(rc_data **)(this + 0x58);
        uVar8 = 0;
        lVar6 = *(long *)(*(long *)(this + 0x70) + 8);
        do {
          auVar1 = vfmadd213ss_fma(ZEXT416(*(uint *)(lVar6 + (long)__first[uVar8].id * 4)),
                                   ZEXT416((uint)local_80),ZEXT416((uint)__first[uVar8].value));
          __first[uVar8].value = auVar1._0_4_;
          uVar8 = uVar8 + 1;
        } while (uVar4 != uVar8);
        if (1 < (int)uVar4) {
          lVar6 = (long)(int)uVar4;
          __g = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                 (this + 8);
          prVar9 = __first + lVar6;
          local_84 = uVar4;
          local_68 = first._M_current;
          std::
          __introsort_loop<baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*>(baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*,baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (__first,prVar9,(int)LZCOUNT(lVar6) * 2 ^ 0x7e);
          local_70 = prVar9;
          std::
          __final_insertion_sort<baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*>(baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*,baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (__first,prVar9);
          lVar6 = lVar6 * 8 + -8;
          prVar9 = __first;
          do {
            prVar9 = prVar9 + 1;
            if ((__first->value != prVar9->value) || (NAN(__first->value) || NAN(prVar9->value))) {
              std::
              shuffle<baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (__first,prVar9,__g);
              __first = prVar9;
            }
            lVar6 = lVar6 + -8;
          } while (lVar6 != 0);
          std::
          shuffle<baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (__first,local_70,__g);
          first._M_current = local_68;
          r_size = local_84;
        }
      }
      args_1 = (uint *)(*(long *)(this + 0x60) + (long)local_8c * 4);
      uVar5 = *args_1;
      if ((int)r_size < (int)uVar5) {
        uVar5 = r_size;
      }
      local_88 = uVar5 - 1;
      fmt_00._M_str = "constraints {}: {} = ";
      fmt_00._M_len = 0x15;
      debug_logger<true>::log<int,int>((debug_logger<true> *)this,fmt_00,&local_8c,(int *)args_1);
      if (0 < (int)r_size) {
        lVar6 = 0;
        do {
          fmt_01._M_str = "{} ({}) ";
          fmt_01._M_len = 8;
          debug_logger<true>::log<float,int>
                    ((debug_logger<true> *)this,fmt_01,(float *)(*(long *)(this + 0x58) + lVar6),
                     (int *)(*(long *)(this + 0x58) + 4 + lVar6));
          lVar6 = lVar6 + 8;
        } while ((ulong)uVar4 << 3 != lVar6);
      }
      fmt_02._M_str = " => Selected: {}\n";
      fmt_02._M_len = 0x11;
      debug_logger<true>::log<int>((debug_logger<true> *)this,fmt_02,&local_88);
      x = local_60;
      bVar3 = affect<baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,float>
                        ((solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                          *)this,local_60,local_38,local_8c,local_88,r_size,local_74,local_78);
      first._M_current = first._M_current + 1;
      local_48 = CONCAT71((int7)((ulong)local_48 >> 8),(byte)local_48 | bVar3);
    } while (first._M_current != local_50);
  }
  return (bool)((byte)local_48 & 1);
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float objective_amplifier)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto r_size =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            // Before sort and select variables, we apply the push method: for
            // each reduces cost, we had the cost multiply with an objective
            // amplifier.

            for (int i = 0; i != r_size; ++i)
                R[i].value += objective_amplifier * c(R[i].id, x);

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
            int selected = select_variables(r_size, b[k]);

            logger::log("constraints {}: {} = ", k, b[k]);

            for (int i = 0; i < r_size; ++i)
                logger::log("{} ({}) ", R[i].value, R[i].id);

            logger::log(" => Selected: {}\n", selected);

            auto pi_change = affect(
              *this, x, std::get<0>(it), k, selected, r_size, kappa, delta);

            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }